

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::HugeIntegerCastOperation::
     HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true,true>
               (HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> *state,uint8_t digit)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t local_58;
  hugeint_t local_48;
  hugeint_t local_38;
  
  bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::Flush(state);
  if (bVar1) {
    hugeint_t::hugeint_t(&local_58,((ulong)digit ^ 0x7ffffffffffffffe) / 10);
    bVar1 = hugeint_t::operator>(&state->decimal_intermediate,&local_58);
    if (bVar1) {
      bVar1 = HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long>::FlushDecimal(state);
      if (!bVar1) goto LAB_01285b6e;
    }
    hugeint_t::hugeint_t(&local_38,10);
    local_58 = hugeint_t::operator*(&state->decimal_intermediate,&local_38);
    hugeint_t::hugeint_t(&local_48,(ulong)digit);
    hVar2 = hugeint_t::operator+(&local_58,&local_48);
    (state->decimal_intermediate).lower = hVar2.lower;
    (state->decimal_intermediate).upper = hVar2.upper;
    state->decimal_intermediate_digits = state->decimal_intermediate_digits + 1;
    bVar1 = true;
  }
  else {
LAB_01285b6e:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool HandleDecimal(T &state, uint8_t digit) {
		if (!state.Flush()) {
			return false;
		}
		if (DUCKDB_UNLIKELY(state.decimal_intermediate > (NumericLimits<int64_t>::Maximum() - digit) / 10)) {
			if (!state.FlushDecimal()) {
				return false;
			}
		}
		state.decimal_intermediate = state.decimal_intermediate * 10 + digit;
		state.decimal_intermediate_digits++;
		return true;
	}